

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UnarySelectPropertyExprSyntax::setChild
          (UnarySelectPropertyExprSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  PropertyExprSyntax *local_160;
  SelectorSyntax *local_158;
  string local_130;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  PropertyExprSyntax *local_58;
  PropertyExprSyntax *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  UnarySelectPropertyExprSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->op).kind = (undefined2)local_28;
    (this->op).field_0x2 = local_28._2_1_;
    (this->op).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->op).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->op).info = local_20;
    break;
  case 1:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->openBracket).kind = (undefined2)local_38;
    (this->openBracket).field_0x2 = local_38._2_1_;
    (this->openBracket).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->openBracket).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->openBracket).info = local_30;
    break;
  case 2:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_158 = (SelectorSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_158 = SyntaxNode::as<slang::syntax::SelectorSyntax>(pSVar1);
    }
    this->selector = local_158;
    break;
  case 3:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar2._0_8_;
    (this->closeBracket).kind = (undefined2)local_48;
    (this->closeBracket).field_0x2 = local_48._2_1_;
    (this->closeBracket).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->closeBracket).rawLen = local_48._4_4_;
    local_40 = TVar2.info;
    (this->closeBracket).info = local_40;
    break;
  case 4:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_160 = (PropertyExprSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_160 = SyntaxNode::as<slang::syntax::PropertyExprSyntax>(pSVar1);
    }
    local_58 = local_160;
    not_null<slang::syntax::PropertyExprSyntax*>::not_null<slang::syntax::PropertyExprSyntax*,void>
              ((not_null<slang::syntax::PropertyExprSyntax*> *)&local_50,&local_58);
    (this->expr).ptr = local_50;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_f9);
    std::operator+(&local_d8,&local_f8,":");
    std::__cxx11::to_string(&local_130,0x34c3);
    std::operator+(&local_b8,&local_d8,&local_130);
    std::operator+(&local_98,&local_b8,": ");
    std::operator+(&local_78,&local_98,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void UnarySelectPropertyExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: op = child.token(); return;
        case 1: openBracket = child.token(); return;
        case 2: selector = child.node() ? &child.node()->as<SelectorSyntax>() : nullptr; return;
        case 3: closeBracket = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}